

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

string * __thiscall
CoreML::enumeratedShapesToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *enumerated,bool useArrayFormat)

{
  string *psVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  string separator;
  stringstream ss;
  char local_204;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar3 = " | ";
  if ((int)enumerated != 0) {
    pcVar3 = ", ";
  }
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,pcVar3,pcVar3 + ((ulong)enumerated & 0xffffffff ^ 3));
  if ((char)((ulong)enumerated & 0xffffffff) != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
  }
  lVar4 = *(long *)this;
  local_1c0 = __return_storage_ptr__;
  if (*(long *)(this + 8) != lVar4) {
    lVar2 = 0;
    uVar5 = 0;
    do {
      dimensionsToString_abi_cxx11_
                (&local_1e0,(CoreML *)(lVar4 + lVar2),
                 (vector<long,_std::allocator<long>_> *)((ulong)enumerated & 0xff),useArrayFormat);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if (uVar5 < (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555 - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_200,local_1f8);
      }
      uVar5 = uVar5 + 1;
      lVar4 = *(long *)this;
      lVar2 = lVar2 + 0x18;
    } while (uVar5 < (ulong)((*(long *)(this + 8) - lVar4 >> 3) * -0x5555555555555555));
  }
  psVar1 = local_1c0;
  local_204 = (char)enumerated;
  if (local_204 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  }
  std::__cxx11::stringbuf::str();
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

static std::string enumeratedShapesToString(const std::vector<std::vector<int64_t>> &enumerated, bool useArrayFormat = false) {
        std::stringstream ss;
        std::string separator = useArrayFormat ? ", " : " | ";

        if (useArrayFormat) {
            ss << "[";
        }

        for (size_t i=0; i<enumerated.size(); i++) {
            ss << dimensionsToString(enumerated[i],useArrayFormat);
            if (i < enumerated.size() - 1) { ss << separator; }
        }

        if (useArrayFormat) {
            ss << "]";
        }

        return ss.str();
    }